

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O0

int ZXing::DataMatrix::FindMinimums(array<int,_6UL> *intCharCounts,int min,array<int,_6UL> *mins)

{
  const_reference pvVar1;
  reference pvVar2;
  value_type_conflict3 *in_RDX;
  int in_ESI;
  int current;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar3;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar4 = 0;
  std::array<int,_6UL>::fill((array<int,_6UL> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  for (iVar3 = 0; iVar3 < 6; iVar3 = iVar3 + 1) {
    pvVar1 = std::array<int,_6UL>::operator[]
                       ((array<int,_6UL> *)CONCAT44(uVar4,iVar3),
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffdc = *pvVar1;
    if (in_stack_ffffffffffffffdc < in_ESI) {
      in_stack_ffffffffffffffd8 = 0;
      in_ESI = in_stack_ffffffffffffffdc;
      std::array<int,_6UL>::fill
                ((array<int,_6UL> *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_fffffffffffffff0),
                 in_RDX);
    }
    if (in_ESI == in_stack_ffffffffffffffdc) {
      pvVar2 = std::array<int,_6UL>::operator[]
                         ((array<int,_6UL> *)CONCAT44(uVar4,iVar3),
                          CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      *pvVar2 = *pvVar2 + 1;
    }
  }
  return in_ESI;
}

Assistant:

static int FindMinimums(const std::array<int, 6>& intCharCounts, int min, std::array<int, 6>& mins)
{
	mins.fill(0);
	for (int i = 0; i < 6; i++) {
		int current = intCharCounts[i];
		if (min > current) {
			min = current;
			mins.fill(0);
		}
		if (min == current) {
			mins[i]++;
		}
	}
	return min;
}